

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidgetPrivate::repaint<QRect>(QWidgetPrivate *this,QRect r)

{
  undefined1 *puVar1;
  QWidgetData **ppQVar2;
  QWidget *widget;
  QWidget *pQVar3;
  long lVar4;
  QWidget *pQVar5;
  long in_FS_OFFSET;
  QRect local_18;
  long local_8;
  
  local_18._8_8_ = r._8_8_;
  local_18._0_8_ = r._0_8_;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  widget = *(QWidget **)&this->field_0x8;
  if ((((widget->data->widget_attributes & 0x8400) == 0x8000) && (r.x1.m_i.m_i <= r.x2.m_i.m_i)) &&
     (pQVar5 = widget, r.y1.m_i.m_i <= r.y2.m_i.m_i)) {
    do {
      puVar1 = &pQVar5->field_0x8;
      pQVar3 = *(QWidget **)(*(long *)puVar1 + 0x10);
      if (pQVar3 == (QWidget *)0x0) break;
      ppQVar2 = &pQVar5->data;
      pQVar5 = pQVar3;
    } while ((((*ppQVar2)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i & 1) == 0);
    lVar4 = *(long *)(*(long *)puVar1 + 0x78);
    if (((lVar4 != 0) && (lVar4 = *(long *)(lVar4 + 8), lVar4 != 0)) &&
       ((*(long *)(lVar4 + 0x10) != 0 &&
        (*(QWidgetRepaintManager **)(lVar4 + 8) != (QWidgetRepaintManager *)0x0)))) {
      QWidgetRepaintManager::markDirty<QRect>
                (*(QWidgetRepaintManager **)(lVar4 + 8),&local_18,widget,UpdateNow,BufferValid);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::repaint(T r)
{
    Q_Q(QWidget);

    if (!q->isVisible() || !q->updatesEnabled() || r.isEmpty())
        return;

    QTLWExtra *tlwExtra = q->window()->d_func()->maybeTopData();
    if (tlwExtra && tlwExtra->backingStore && tlwExtra->repaintManager)
        tlwExtra->repaintManager->markDirty(r, q, QWidgetRepaintManager::UpdateNow);
}